

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>::Data
          (Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_> *this,
          size_t reserve)

{
  long lVar1;
  QHashSeed QVar2;
  size_t numBuckets;
  R_conflict7 RVar3;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = 0;
  this->numBuckets = 0;
  this->seed = 0;
  this->spans = (Span *)0x0;
  numBuckets = 0x80;
  if ((0x40 < reserve) && (numBuckets = 0xffffffffffffffff, reserve >> 0x3e == 0)) {
    lVar1 = 0x3f;
    if (reserve != 0) {
      for (; reserve >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar1 ^ 0x3f) & 0x3f);
  }
  this->numBuckets = numBuckets;
  RVar3 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar3.spans;
  QVar2 = QHashSeed::globalSeed();
  this->seed = QVar2.data;
  return;
}

Assistant:

Data(size_t reserve = 0)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(reserve);
        spans = allocateSpans(numBuckets).spans;
        seed = QHashSeed::globalSeed();
    }